

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-names.cc
# Opt level: O0

Result wabt::GenerateNames(Module *module,NameOpts opts)

{
  Result RVar1;
  undefined1 local_b8 [8];
  NameGenerator generator;
  NameOpts opts_local;
  Module *module_local;
  
  generator._148_4_ = opts;
  anon_unknown_18::NameGenerator::NameGenerator((NameGenerator *)local_b8,opts);
  RVar1 = anon_unknown_18::NameGenerator::VisitModule((NameGenerator *)local_b8,module);
  anon_unknown_18::NameGenerator::~NameGenerator((NameGenerator *)local_b8);
  return (Result)RVar1.enum_;
}

Assistant:

Result GenerateNames(Module* module, NameOpts opts) {
  NameGenerator generator(opts);
  return generator.VisitModule(module);
}